

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuApp.cpp
# Opt level: O0

void __thiscall tcu::App::onCrash(App *this)

{
  qpCrashHandler *crashHandler;
  bool bVar1;
  TestLog *pTVar2;
  bool local_21;
  bool isInCase;
  App *this_local;
  
  bVar1 = de::Mutex::tryLock(&this->m_crashLock);
  if ((bVar1) && ((this->m_crashed & 1U) == 0)) {
    this->m_crashed = true;
    if (this->m_testExecutor == (TestSessionExecutor *)0x0) {
      local_21 = false;
    }
    else {
      local_21 = TestSessionExecutor::isInTestCase(this->m_testExecutor);
    }
    if (local_21 == false) {
      qpCrashHandler_writeCrashInfo(this->m_crashHandler,writeCrashToConsole,(void *)0x0);
    }
    else {
      crashHandler = this->m_crashHandler;
      pTVar2 = TestContext::getLog(this->m_testCtx);
      qpCrashHandler_writeCrashInfo(crashHandler,writeCrashToLog,pTVar2);
      pTVar2 = TestContext::getLog(this->m_testCtx);
      TestLog::terminateCase(pTVar2,QP_TEST_RESULT_CRASH);
    }
    die("Test program crashed");
  }
  return;
}

Assistant:

void App::onCrash (void)
{
	// \note THIS IS CALLED BY SIGNAL HANDLER! CALLING MALLOC/FREE IS NOT ALLOWED!

	if (!m_crashLock.tryLock() || m_crashed)
		return; // In crash handler already.

	m_crashed = true;

	bool isInCase = m_testExecutor ? m_testExecutor->isInTestCase() : false;

	if (isInCase)
	{
		qpCrashHandler_writeCrashInfo(m_crashHandler, writeCrashToLog, &m_testCtx->getLog());
		m_testCtx->getLog().terminateCase(QP_TEST_RESULT_CRASH);
	}
	else
		qpCrashHandler_writeCrashInfo(m_crashHandler, writeCrashToConsole, DE_NULL);

	die("Test program crashed");
}